

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

QString * formatFunctionSignature(QString *__return_storage_ptr__,QList<Tracepoint::Argument> *args)

{
  bool bVar1;
  long lVar2;
  Argument *arg;
  Argument *a;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  a = (args->d).ptr;
  bVar1 = true;
  for (lVar2 = (args->d).size * 0x38; lVar2 != 0; lVar2 = lVar2 + -0x38) {
    if (!bVar1) {
      str.m_size = 2;
      str.m_data = ", ";
      QString::append(__return_storage_ptr__,str);
    }
    local_80.d = (Data *)0x0;
    local_80.ptr = (char16_t *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = L"%1 %2";
    local_80.size = 0;
    local_68.size = 5;
    bVar1 = false;
    QString::arg<QString,_true>((QString *)&local_50,(QString *)&local_68,&a->type,0,(QChar)0x20);
    QString::arg<QString,_true>((QString *)&local_98,(QString *)&local_50,&a->name,0,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QString::append(__return_storage_ptr__,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    a = a + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString formatFunctionSignature(const QList<Tracepoint::Argument> &args)
{
    return joinArguments(args, [](const Tracepoint::Argument &arg) {
            return QStringLiteral("%1 %2").arg(arg.type).arg(arg.name);
    });
}